

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_op_tags.hpp
# Opt level: O1

string * __thiscall
viennamath::op_partial_deriv<double>::str_abi_cxx11_
          (string *__return_storage_ptr__,op_partial_deriv<double> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"partial_deriv<",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;
        ss << "partial_deriv<" << id_ << ">";
        return ss.str();
      }